

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::JsonUnitTestResultPrinter::PrintJsonUnitTest
               (ostream *stream,UnitTest *unit_test)

{
  undefined8 *puVar1;
  size_type *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  char *pcVar4;
  pointer ppTVar5;
  int iVar6;
  tm *ptVar7;
  long *plVar8;
  undefined8 *puVar9;
  ostream *poVar10;
  UnitTestImpl *pUVar11;
  bool bVar12;
  ulong *puVar13;
  TimeInMillis ms;
  pointer ppTVar14;
  pointer ppTVar15;
  ulong uVar16;
  undefined8 uVar17;
  uint uVar18;
  long lVar19;
  string kIndent;
  string kTestsuites;
  tm time_struct;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  undefined1 local_270 [56];
  ulong *local_238;
  long local_230;
  ulong local_228;
  long lStack_220;
  undefined8 *local_218;
  undefined8 local_210;
  undefined8 local_208;
  undefined8 uStack_200;
  ulong *local_1f8;
  long local_1f0;
  ulong local_1e8;
  long lStack_1e0;
  undefined8 *local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  ulong *local_1b8;
  long local_1b0;
  ulong local_1a8;
  long lStack_1a0;
  undefined8 *local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  ulong *local_178;
  long local_170;
  ulong local_168;
  long lStack_160;
  undefined8 *local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  ulong *local_138;
  long local_130;
  ulong local_128;
  long lStack_120;
  int local_114;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"testsuites","");
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_2f0,'\x02');
  std::__ostream_insert<char,std::char_traits<char>>(stream,"{\n",2);
  pcVar4 = local_270 + 0x10;
  local_270._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"tests","");
  iVar6 = UnitTestImpl::reportable_test_count(unit_test->impl_);
  OutputJsonKey(stream,&local_2b0,(string *)local_270,iVar6,&local_2f0,true);
  if ((char *)local_270._0_8_ != pcVar4) {
    operator_delete((void *)local_270._0_8_);
  }
  local_270._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"failures","");
  iVar6 = UnitTestImpl::failed_test_count(unit_test->impl_);
  OutputJsonKey(stream,&local_2b0,(string *)local_270,iVar6,&local_2f0,true);
  if ((char *)local_270._0_8_ != pcVar4) {
    operator_delete((void *)local_270._0_8_);
  }
  local_270._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"disabled","");
  iVar6 = UnitTestImpl::reportable_disabled_test_count(unit_test->impl_);
  OutputJsonKey(stream,&local_2b0,(string *)local_270,iVar6,&local_2f0,true);
  if ((char *)local_270._0_8_ != pcVar4) {
    operator_delete((void *)local_270._0_8_);
  }
  local_270._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"errors","");
  OutputJsonKey(stream,&local_2b0,(string *)local_270,0,&local_2f0,true);
  if ((char *)local_270._0_8_ != pcVar4) {
    operator_delete((void *)local_270._0_8_);
  }
  if (FLAGS_gtest_shuffle == '\x01') {
    local_270._0_8_ = pcVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"random_seed","");
    OutputJsonKey(stream,&local_2b0,(string *)local_270,unit_test->impl_->random_seed_,&local_2f0,
                  true);
    if ((char *)local_270._0_8_ != pcVar4) {
      operator_delete((void *)local_270._0_8_);
    }
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"timestamp","");
  local_2d0._M_dataplus._M_p = (pointer)(unit_test->impl_->start_timestamp_ / 1000);
  ptVar7 = localtime_r((time_t *)&local_2d0,(tm *)local_270);
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  if (ptVar7 == (tm *)0x0) {
    local_290._M_string_length = 0;
    local_290.field_2._M_allocated_capacity =
         local_290.field_2._M_allocated_capacity & 0xffffffffffffff00;
    goto LAB_0012c1b4;
  }
  local_114 = local_270._20_4_ + 0x76c;
  StreamableToString<int>(&local_50,&local_114);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_228 = *puVar13;
    lStack_220 = plVar8[3];
    local_238 = &local_228;
  }
  else {
    local_228 = *puVar13;
    local_238 = (ulong *)*plVar8;
  }
  local_230 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_d0,(String *)(ulong)(local_270._16_4_ + 1),(int)local_230);
  uVar16 = 0xf;
  if (local_238 != &local_228) {
    uVar16 = local_228;
  }
  if (uVar16 < local_d0._M_string_length + local_230) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      uVar17 = local_d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_d0._M_string_length + local_230) goto LAB_0012ba6c;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_238);
  }
  else {
LAB_0012ba6c:
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_238,(ulong)local_d0._M_dataplus._M_p);
  }
  local_218 = &local_208;
  puVar1 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar1) {
    local_208 = *puVar1;
    uStack_200 = puVar9[3];
  }
  else {
    local_208 = *puVar1;
    local_218 = (undefined8 *)*puVar9;
  }
  local_210 = puVar9[1];
  *puVar9 = puVar1;
  puVar9[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_218);
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_1e8 = *puVar13;
    lStack_1e0 = plVar8[3];
    local_1f8 = &local_1e8;
  }
  else {
    local_1e8 = *puVar13;
    local_1f8 = (ulong *)*plVar8;
  }
  local_1f0 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_f0,(String *)(ulong)(uint)local_270._12_4_,(int)local_1f0);
  uVar16 = 0xf;
  if (local_1f8 != &local_1e8) {
    uVar16 = local_1e8;
  }
  if (uVar16 < local_f0._M_string_length + local_1f0) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      uVar17 = local_f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_f0._M_string_length + local_1f0) goto LAB_0012bbb0;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_1f8);
  }
  else {
LAB_0012bbb0:
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_f0._M_dataplus._M_p);
  }
  local_1d8 = &local_1c8;
  puVar1 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar1) {
    local_1c8 = *puVar1;
    uStack_1c0 = puVar9[3];
  }
  else {
    local_1c8 = *puVar1;
    local_1d8 = (undefined8 *)*puVar9;
  }
  local_1d0 = puVar9[1];
  *puVar9 = puVar1;
  puVar9[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_1d8);
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_1a8 = *puVar13;
    lStack_1a0 = plVar8[3];
    local_1b8 = &local_1a8;
  }
  else {
    local_1a8 = *puVar13;
    local_1b8 = (ulong *)*plVar8;
  }
  local_1b0 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_110,(String *)(ulong)(uint)local_270._8_4_,(int)local_1b0);
  uVar16 = 0xf;
  if (local_1b8 != &local_1a8) {
    uVar16 = local_1a8;
  }
  if (uVar16 < local_110._M_string_length + local_1b0) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      uVar17 = local_110.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_110._M_string_length + local_1b0) goto LAB_0012bcf4;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_1b8);
  }
  else {
LAB_0012bcf4:
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1b8,(ulong)local_110._M_dataplus._M_p);
  }
  local_198 = &local_188;
  puVar1 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar1) {
    local_188 = *puVar1;
    uStack_180 = puVar9[3];
  }
  else {
    local_188 = *puVar1;
    local_198 = (undefined8 *)*puVar9;
  }
  local_190 = puVar9[1];
  *puVar9 = puVar1;
  puVar9[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_198);
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_168 = *puVar13;
    lStack_160 = plVar8[3];
    local_178 = &local_168;
  }
  else {
    local_168 = *puVar13;
    local_178 = (ulong *)*plVar8;
  }
  local_170 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_70,(String *)((ulong)local_270._0_8_ >> 0x20),(int)local_170);
  uVar16 = 0xf;
  if (local_178 != &local_168) {
    uVar16 = local_168;
  }
  if (uVar16 < local_70._M_string_length + local_170) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      uVar17 = local_70.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_70._M_string_length + local_170) goto LAB_0012be39;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_178);
  }
  else {
LAB_0012be39:
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_178,(ulong)local_70._M_dataplus._M_p);
  }
  local_158 = &local_148;
  puVar1 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar1) {
    local_148 = *puVar1;
    uStack_140 = puVar9[3];
  }
  else {
    local_148 = *puVar1;
    local_158 = (undefined8 *)*puVar9;
  }
  local_150 = puVar9[1];
  *puVar9 = puVar1;
  puVar9[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_158);
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_128 = *puVar13;
    lStack_120 = plVar8[3];
    local_138 = &local_128;
  }
  else {
    local_128 = *puVar13;
    local_138 = (ulong *)*plVar8;
  }
  local_130 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_90,(String *)(local_270._0_8_ & 0xffffffff),(int)local_130);
  uVar16 = 0xf;
  if (local_138 != &local_128) {
    uVar16 = local_128;
  }
  if (uVar16 < local_90._M_string_length + local_130) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      uVar17 = local_90.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_90._M_string_length + local_130) goto LAB_0012bf7c;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_138);
  }
  else {
LAB_0012bf7c:
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_90._M_dataplus._M_p);
  }
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  psVar2 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_2d0.field_2._M_allocated_capacity = *psVar2;
    local_2d0.field_2._8_8_ = puVar9[3];
  }
  else {
    local_2d0.field_2._M_allocated_capacity = *psVar2;
    local_2d0._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_2d0._M_string_length = puVar9[1];
  *puVar9 = psVar2;
  puVar9[1] = 0;
  *(undefined1 *)psVar2 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_2d0);
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13) {
    local_290.field_2._M_allocated_capacity = *puVar13;
    local_290.field_2._8_8_ = plVar8[3];
  }
  else {
    local_290.field_2._M_allocated_capacity = *puVar13;
    local_290._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_290._M_string_length = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_138 != &local_128) {
    operator_delete(local_138);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178);
  }
  if (local_198 != &local_188) {
    operator_delete(local_198);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8);
  }
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (local_238 != &local_228) {
    operator_delete(local_238);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
LAB_0012c1b4:
  OutputJsonKey(stream,&local_2b0,&local_b0,&local_290,&local_2f0,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  local_270._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"time","");
  FormatTimeInMillisAsDuration_abi_cxx11_(&local_2d0,(internal *)unit_test->impl_->elapsed_time_,ms)
  ;
  OutputJsonKey(stream,&local_2b0,(string *)local_270,&local_2d0,&local_2f0,false);
  paVar3 = &local_2d0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != paVar3) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  if ((char *)local_270._0_8_ != pcVar4) {
    operator_delete((void *)local_270._0_8_);
  }
  TestPropertiesAsJson((string *)local_270,&unit_test->impl_->ad_hoc_test_result_,&local_2f0);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (stream,(char *)local_270._0_8_,CONCAT44(local_270._12_4_,local_270._8_4_));
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,",\n",2);
  if ((char *)local_270._0_8_ != pcVar4) {
    operator_delete((void *)local_270._0_8_);
  }
  local_270._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"name","");
  local_2d0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"AllTests","");
  OutputJsonKey(stream,&local_2b0,(string *)local_270,&local_2d0,&local_2f0,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != paVar3) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  if ((char *)local_270._0_8_ != pcVar4) {
    operator_delete((void *)local_270._0_8_);
  }
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (stream,local_2f0._M_dataplus._M_p,local_2f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"",1);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\": [\n",5);
  pUVar11 = unit_test->impl_;
  ppTVar14 = (pUVar11->test_cases_).
             super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(pUVar11->test_cases_).
                              super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar14) >> 3)) {
    lVar19 = 0;
    bVar12 = false;
    do {
      ppTVar15 = (ppTVar14[lVar19]->test_info_list_).
                 super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppTVar5 = *(pointer *)
                 ((long)&(ppTVar14[lVar19]->test_info_list_).
                         super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                         ._M_impl + 8);
      if (ppTVar15 != ppTVar5) {
        iVar6 = 0;
        do {
          uVar18 = (*ppTVar15)->is_in_another_shard_ ^ 1;
          if ((*ppTVar15)->matches_filter_ == false) {
            uVar18 = 0;
          }
          iVar6 = iVar6 + uVar18;
          ppTVar15 = ppTVar15 + 1;
        } while (ppTVar15 != ppTVar5);
        if (iVar6 != 0) {
          if (bVar12) {
            std::__ostream_insert<char,std::char_traits<char>>(stream,",\n",2);
            pUVar11 = unit_test->impl_;
          }
          PrintJsonTestCase(stream,(pUVar11->test_cases_).
                                   super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start[lVar19]);
          pUVar11 = unit_test->impl_;
          bVar12 = true;
        }
      }
      lVar19 = lVar19 + 1;
      ppTVar14 = (pUVar11->test_cases_).
                 super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    } while (lVar19 < (int)((ulong)((long)(pUVar11->test_cases_).
                                          super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)ppTVar14) >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (stream,local_2f0._M_dataplus._M_p,local_2f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"}\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonUnitTest(std::ostream* stream,
                                                  const UnitTest& unit_test) {
  const std::string kTestsuites = "testsuites";
  const std::string kIndent = Indent(2);
  *stream << "{\n";

  OutputJsonKey(stream, kTestsuites, "tests", unit_test.reportable_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "failures", unit_test.failed_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "disabled",
                unit_test.reportable_disabled_test_count(), kIndent);
  OutputJsonKey(stream, kTestsuites, "errors", 0, kIndent);
  if (GTEST_FLAG(shuffle)) {
    OutputJsonKey(stream, kTestsuites, "random_seed", unit_test.random_seed(),
                  kIndent);
  }
  OutputJsonKey(stream, kTestsuites, "timestamp",
                FormatEpochTimeInMillisAsRFC3339(unit_test.start_timestamp()),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "time",
                FormatTimeInMillisAsDuration(unit_test.elapsed_time()), kIndent,
                false);

  *stream << TestPropertiesAsJson(unit_test.ad_hoc_test_result(), kIndent)
          << ",\n";

  OutputJsonKey(stream, kTestsuites, "name", "AllTests", kIndent);
  *stream << kIndent << "\"" << kTestsuites << "\": [\n";

  bool comma = false;
  for (int i = 0; i < unit_test.total_test_case_count(); ++i) {
    if (unit_test.GetTestCase(i)->reportable_test_count() > 0) {
      if (comma) {
        *stream << ",\n";
      } else {
        comma = true;
      }
      PrintJsonTestCase(stream, *unit_test.GetTestCase(i));
    }
  }

  *stream << "\n" << kIndent << "]\n" << "}\n";
}